

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

FILE * phosg::fdopen_binary_raw(int fd,string *mode)

{
  size_type sVar1;
  FILE *pFVar2;
  cannot_open_file *this;
  string new_mode;
  
  ::std::__cxx11::string::string
            ((string *)&new_mode,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)mode);
  sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_mode,
                     'b',0);
  if (sVar1 == 0xffffffffffffffff) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_mode,'b');
  }
  pFVar2 = fdopen(fd,new_mode._M_dataplus._M_p);
  if (pFVar2 != (FILE *)0x0) {
    ::std::__cxx11::string::~string((string *)&new_mode);
    return (FILE *)pFVar2;
  }
  this = (cannot_open_file *)__cxa_allocate_exception(0x20);
  cannot_open_file::cannot_open_file(this,fd);
  __cxa_throw(this,&cannot_open_file::typeinfo,cannot_open_file::~cannot_open_file);
}

Assistant:

static FILE* fdopen_binary_raw(int fd, const string& mode) {
  string new_mode = mode;
  if (new_mode.find('b') == string::npos) {
    new_mode += 'b';
  }
  FILE* f = fdopen(fd, new_mode.c_str());
  if (!f) {
    throw cannot_open_file(fd);
  }
  return f;
}